

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
FeatureResolverPoolTest_CompileDefaultsInvalidDeprecatedBeforeIntroduced_Test::TestBody
          (FeatureResolverPoolTest_CompileDefaultsInvalidDeprecatedBeforeIntroduced_Test *this)

{
  FieldDescriptor *pFVar1;
  undefined8 extraout_RAX;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar2;
  string_view schema;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions;
  FileDescriptor *file;
  Edition in_stack_fffffffffffffe78;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  char local_140 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  FileDescriptor *local_d0;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  FieldDescriptor *local_a8;
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  schema._M_str =
       "\n    syntax = \"proto2\";\n    package test;\n    import \"google/protobuf/descriptor.proto\";\n\n    extend google.protobuf.FeatureSet {\n      optional Foo bar = 9999;\n    }\n    message Foo {\n      optional bool bool_field = 1 [\n        targets = TARGET_TYPE_FIELD,\n        feature_support = {\n          edition_introduced: EDITION_2024\n          edition_deprecated: EDITION_2023\n          deprecation_warning: \"warning\"\n        },\n        edition_defaults = { edition: EDITION_LEGACY, value: \"true\" }\n      ];\n    }\n  "
  ;
  schema._M_len = 0x200;
  local_d0 = FeatureResolverPoolTest::ParseSchema(&this->super_FeatureResolverPoolTest,schema);
  local_110.
  super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
  ._M_head_impl.impl_.substring_._M_dataplus._M_p = (pointer)0x0;
  testing::internal::CmpHelperNE<google::protobuf::FileDescriptor_const*,decltype(nullptr)>
            ((internal *)&local_180.status_,"file","nullptr",&local_d0,(void **)&local_110);
  if (local_180.status_.rep_._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_110);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
               ,0x480,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    if ((long *)local_110.
                super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .
                super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                ._M_head_impl.impl_.substring_._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_110.
                            super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            .
                            super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                            ._M_head_impl.impl_.substring_._M_dataplus._M_p + 8))();
    }
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_178;
    local_138 = local_178;
  }
  else {
    if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_178,local_178);
    }
    if (local_d0->extension_count_ < 1) {
      protobuf::_GLOBAL__N_1::
      FeatureResolverPoolTest_CompileDefaultsInvalidDeprecatedBeforeIntroduced_Test::TestBody();
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
      if ((long *)CONCAT71(local_180.status_.rep_._1_7_,local_180.status_.rep_._0_1_) != (long *)0x0
         ) {
        (**(code **)(*(long *)CONCAT71(local_180.status_.rep_._1_7_,local_180.status_.rep_._0_1_) +
                    8))();
      }
      if (local_138 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_138,local_138);
      }
      _Unwind_Resume(extraout_RAX);
    }
    pFVar1 = local_d0->extensions_;
    testing::HasSubstr<char[20]>(&local_130,(StringLike<char[20]> *)"test.Foo.bool_field");
    testing::HasSubstr<char[36]>
              (&local_c8,(StringLike<char[36]> *)"deprecated before it was introduced");
    std::
    _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Tuple_impl(&local_a0,&local_130,&local_c8);
    std::
    _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Tuple_impl((_Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_180.status_,&local_a0);
    std::
    _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Tuple_impl(&local_60,
                  (_Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_180.status_);
    if (local_160 != &local_150) {
      operator_delete(local_160,local_150._M_allocated_capacity + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
        CONCAT71(local_180.status_.rep_._1_7_,local_180.status_.rep_._0_1_) != local_170) {
      operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      CONCAT71(local_180.status_.rep_._1_7_,local_180.status_.rep_._0_1_),
                      (ulong)((long)&(local_170[0]->_M_dataplus)._M_p + 1));
    }
    std::
    _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Tuple_impl((_Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_180.status_,&local_60);
    std::
    _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Tuple_impl(&local_110,
                  (_Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_180.status_);
    if (local_160 != &local_150) {
      operator_delete(local_160,local_150._M_allocated_capacity + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
        CONCAT71(local_180.status_.rep_._1_7_,local_180.status_.rep_._0_1_) != local_170) {
      operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      CONCAT71(local_180.status_.rep_._1_7_,local_180.status_.rep_._0_1_),
                      (ulong)((long)&(local_170[0]->_M_dataplus)._M_p + 1));
    }
    extensions.len_ = 1000;
    extensions.ptr_ = (pointer)0x1;
    local_a8 = pFVar1;
    FeatureResolver::CompileDefaults
              ((StatusOr<google::protobuf::FeatureSetDefaults> *)&local_180.status_,
               (FeatureResolver *)(this->super_FeatureResolverPoolTest).feature_set_,
               (Descriptor *)&local_a8,extensions,EDITION_2023,in_stack_fffffffffffffe78);
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>>
    ::operator()(local_140,(char *)&local_110,
                 (StatusOr<google::protobuf::FeatureSetDefaults> *)&local_180.status_);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
    ~StatusOrData((StatusOrData<google::protobuf::FeatureSetDefaults> *)&local_180.status_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.
           super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           ._M_head_impl.impl_.substring_._M_dataplus._M_p !=
        &local_110.
         super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
         ._M_head_impl.impl_.substring_.field_2) {
      operator_delete(local_110.
                      super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                      ._M_head_impl.impl_.substring_._M_dataplus._M_p,
                      local_110.
                      super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                      ._M_head_impl.impl_.substring_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.
           super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           ._M_head_impl.impl_.substring_._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&local_110.
                   super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   .
                   super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                   ._M_head_impl.impl_.substring_ + 0x10U)) {
      operator_delete(local_110.
                      super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      .
                      super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                      ._M_head_impl.impl_.substring_._M_dataplus._M_p,
                      local_110.
                      super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      .
                      super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                      ._M_head_impl.impl_.substring_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.
           super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           ._M_head_impl.impl_.substring_._M_dataplus._M_p !=
        &local_60.
         super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
         ._M_head_impl.impl_.substring_.field_2) {
      operator_delete(local_60.
                      super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                      ._M_head_impl.impl_.substring_._M_dataplus._M_p,
                      local_60.
                      super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                      ._M_head_impl.impl_.substring_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.
           super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           ._M_head_impl.impl_.substring_._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&local_60.
                   super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   .
                   super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                   ._M_head_impl.impl_.substring_ + 0x10U)) {
      operator_delete(local_60.
                      super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      .
                      super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                      ._M_head_impl.impl_.substring_._M_dataplus._M_p,
                      local_60.
                      super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      .
                      super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                      ._M_head_impl.impl_.substring_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.
           super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           ._M_head_impl.impl_.substring_._M_dataplus._M_p !=
        &local_a0.
         super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
         ._M_head_impl.impl_.substring_.field_2) {
      operator_delete(local_a0.
                      super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                      ._M_head_impl.impl_.substring_._M_dataplus._M_p,
                      local_a0.
                      super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                      ._M_head_impl.impl_.substring_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.
           super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           ._M_head_impl.impl_.substring_._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&local_a0.
                   super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   .
                   super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                   ._M_head_impl.impl_.substring_ + 0x10U)) {
      operator_delete(local_a0.
                      super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      .
                      super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                      ._M_head_impl.impl_.substring_._M_dataplus._M_p,
                      local_a0.
                      super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      .
                      super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                      ._M_head_impl.impl_.substring_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.impl_.substring_._M_dataplus._M_p != &local_c8.impl_.substring_.field_2) {
      operator_delete(local_c8.impl_.substring_._M_dataplus._M_p,
                      local_c8.impl_.substring_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.impl_.substring_._M_dataplus._M_p != &local_130.impl_.substring_.field_2) {
      operator_delete(local_130.impl_.substring_._M_dataplus._M_p,
                      local_130.impl_.substring_.field_2._M_allocated_capacity + 1);
    }
    if (local_140[0] == '\0') {
      testing::Message::Message((Message *)&local_180.status_);
      if (local_138 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar2 = (local_138->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
                 ,0x487,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_110,(Message *)&local_180.status_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
      if ((long *)CONCAT71(local_180.status_.rep_._1_7_,local_180.status_.rep_._0_1_) != (long *)0x0
         ) {
        (**(code **)(*(long *)CONCAT71(local_180.status_.rep_._1_7_,local_180.status_.rep_._0_1_) +
                    8))();
      }
    }
    if (local_138 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_138;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_138);
  return;
}

Assistant:

TEST_F(FeatureResolverPoolTest,
       CompileDefaultsInvalidDeprecatedBeforeIntroduced) {
  const FileDescriptor* file = ParseSchema(R"schema(
    syntax = "proto2";
    package test;
    import "google/protobuf/descriptor.proto";

    extend google.protobuf.FeatureSet {
      optional Foo bar = 9999;
    }
    message Foo {
      optional bool bool_field = 1 [
        targets = TARGET_TYPE_FIELD,
        feature_support = {
          edition_introduced: EDITION_2024
          edition_deprecated: EDITION_2023
          deprecation_warning: "warning"
        },
        edition_defaults = { edition: EDITION_LEGACY, value: "true" }
      ];
    }
  )schema");
  ASSERT_NE(file, nullptr);

  const FieldDescriptor* ext = file->extension(0);
  EXPECT_THAT(
      FeatureResolver::CompileDefaults(feature_set_, {ext}, EDITION_2023,
                                       EDITION_2023),
      HasError(AllOf(HasSubstr("test.Foo.bool_field"),
                     HasSubstr("deprecated before it was introduced"))));
}